

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::StartScheduledTasks
          (PeerManagerImpl *this,CScheduler *scheduler)

{
  Function f;
  Function f_00;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  _Manager_type in_stack_ffffffffffffff20;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  FastRandomContext local_b0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2110:29)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2110:29)>
             ::_M_manager;
  f.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff10;
  f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff08;
  f.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff18;
  f._M_invoker = (_Invoker_type)in_stack_ffffffffffffff20;
  local_d0._M_unused._M_object = this;
  CScheduler::scheduleEvery(scheduler,f,(milliseconds)&local_d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  FastRandomContext::FastRandomContext(&local_b0,false);
  RandomMixin<FastRandomContext>::randrange<long>
            (&local_b0.super_RandomMixin<FastRandomContext>,300000);
  ChaCha20::~ChaCha20(&local_b0.rng);
  f_00.super__Function_base._M_functor._8_8_ = this;
  f_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff08;
  f_00.super__Function_base._M_manager = (_Manager_type)scheduler;
  f_00._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2114:31)>
       ::_M_manager;
  CScheduler::scheduleFromNow(scheduler,f_00,(milliseconds)&stack0xffffffffffffff10);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::StartScheduledTasks(CScheduler& scheduler)
{
    // Stale tip checking and peer eviction are on two different timers, but we
    // don't want them to get out of sync due to drift in the scheduler, so we
    // combine them in one function and schedule at the quicker (peer-eviction)
    // timer.
    static_assert(EXTRA_PEER_CHECK_INTERVAL < STALE_CHECK_INTERVAL, "peer eviction timer should be less than stale tip check timer");
    scheduler.scheduleEvery([this] { this->CheckForStaleTipAndEvictPeers(); }, std::chrono::seconds{EXTRA_PEER_CHECK_INTERVAL});

    // schedule next run for 10-15 minutes in the future
    const auto delta = 10min + FastRandomContext().randrange<std::chrono::milliseconds>(5min);
    scheduler.scheduleFromNow([&] { ReattemptInitialBroadcast(scheduler); }, delta);
}